

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O2

void __thiscall
wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer::visitBlock(wasm::Block__
          (void *this,Block *curr)

{
  ExpressionList *this_00;
  Break *this_01;
  Expression *ast;
  bool bVar1;
  Expression **ppEVar2;
  Expression *pEVar3;
  Unary *pUVar4;
  ulong uVar5;
  Binary *pBVar6;
  Drop *pDVar7;
  Index index;
  Nop *output;
  ulong uVar8;
  uint uVar9;
  Break *this_02;
  Expression *pEVar10;
  Builder local_1c0;
  Builder builder;
  
  this_00 = &curr->list;
  index = 1;
  do {
    uVar8 = (ulong)(index - 1);
    uVar5 = (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
            usedElements;
    if (uVar5 <= uVar8) {
      if (1 < uVar5) {
        for (uVar9 = 1; uVar8 = (ulong)(uVar9 - 1), uVar8 < uVar5 - 1; uVar9 = uVar9 + 1) {
          ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&this_00->
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,uVar8);
          pEVar3 = *ppEVar2;
          if (((pEVar3->_id == BreakId) && (pEVar3[2].type.id != 0)) && ((pEVar3->type).id != 1)) {
            if (*(long *)(pEVar3 + 2) != 0) {
              __assert_fail("!br1->value",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                            ,0x3c3,
                            "void wasm::RemoveUnusedBrs::doWalkFunction(Function *)::FinalOptimizer::visitBlock(Block *)"
                           );
            }
            ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                      operator[](&this_00->
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 ,(ulong)uVar9);
            pEVar10 = *ppEVar2;
            if ((pEVar10->_id == BreakId) && (pEVar3[1].type.id == pEVar10[1].type.id)) {
              if (*(long *)(pEVar10 + 2) != 0) {
                __assert_fail("!br2->value",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                              ,0x3c8,
                              "void wasm::RemoveUnusedBrs::doWalkFunction(Function *)::FinalOptimizer::visitBlock(Block *)"
                             );
              }
              ast = (Expression *)pEVar10[2].type.id;
              if (ast == (Expression *)0x0) {
                local_1c0.wasm = *(Module **)((long)this + 0xd0);
                pDVar7 = Builder::makeDrop(&stack0xfffffffffffffe40,(Expression *)pEVar3[2].type.id)
                ;
                ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                          operator[](&this_00->
                                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                     ,uVar8);
                *ppEVar2 = (Expression *)pDVar7;
              }
              else if ((*(char *)((long)this + 0xd8) == '\x01') && ((pEVar10->type).id != 1)) {
                EffectAnalyzer::EffectAnalyzer
                          ((EffectAnalyzer *)&stack0xfffffffffffffe40,
                           *(PassOptions **)((long)this + 0xe0),*(Module **)((long)this + 0xd0),ast)
                ;
                bVar1 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)&stack0xfffffffffffffe40);
                EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&stack0xfffffffffffffe40);
                if (!bVar1) {
                  local_1c0.wasm = *(Module **)((long)this + 0xd0);
                  pBVar6 = Builder::makeBinary(&stack0xfffffffffffffe40,OrInt32,
                                               (Expression *)pEVar3[2].type.id,
                                               (Expression *)pEVar10[2].type.id);
                  pEVar3[2].type.id = (uintptr_t)pBVar6;
                  pEVar10->_id = NopId;
                  (pEVar10->type).id = 0;
                }
              }
            }
          }
          uVar5 = (curr->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements;
        }
        tablify(wasm::Block__(this,curr);
        restructureIf(wasm::Block__(this,curr);
      }
      return;
    }
    ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&this_00->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,uVar8);
    pEVar3 = *ppEVar2;
    if ((pEVar3->_id == IfId) && (this_02 = *(Break **)(pEVar3 + 2), this_02 != (Break *)0x0)) {
      this_01 = (Break *)pEVar3[1].type.id;
      if (((this_01->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id ==
           BreakId) && (this_01->condition == (Expression *)0x0)) {
        pEVar10 = pEVar3 + 2;
        bVar1 = canTurnIfIntoBrIf(*(Expression **)(pEVar3 + 1),this_01->value,
                                  *(PassOptions **)((long)this + 0xe0),
                                  *(Module **)((long)this + 0xd0));
        if (!bVar1) {
          this_02 = *(Break **)pEVar10;
          goto LAB_0095609d;
        }
        this_01->condition = *(Expression **)(pEVar3 + 1);
        Break::finalize(this_01);
        local_1c0.wasm = *(Module **)((long)this + 0xd0);
        pEVar3 = Builder::dropIfConcretelyTyped(&stack0xfffffffffffffe40,(Expression *)this_01);
        ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this_00->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,uVar8);
        *ppEVar2 = pEVar3;
LAB_0095613d:
        ExpressionManipulator::spliceIntoBlock(curr,index,*(Expression **)pEVar10);
      }
      else {
LAB_0095609d:
        if (((this_02->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id ==
             BreakId) && (this_02->condition == (Expression *)0x0)) {
          bVar1 = canTurnIfIntoBrIf(*(Expression **)(pEVar3 + 1),this_02->value,
                                    *(PassOptions **)((long)this + 0xe0),
                                    *(Module **)((long)this + 0xd0));
          if (bVar1) {
            local_1c0.wasm = *(Module **)((long)this + 0xd0);
            pEVar10 = (Expression *)&pEVar3[1].type;
            pUVar4 = Builder::makeUnary(&stack0xfffffffffffffe40,EqZInt32,
                                        *(Expression **)(pEVar3 + 1));
            this_02->condition = (Expression *)pUVar4;
            Break::finalize(this_02);
            local_1c0.wasm = *(Module **)((long)this + 0xd0);
            pEVar3 = Builder::dropIfConcretelyTyped(&stack0xfffffffffffffe40,(Expression *)this_02);
            ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                      operator[](&this_00->
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 ,uVar8);
            *ppEVar2 = pEVar3;
            goto LAB_0095613d;
          }
        }
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

void visitBlock(Block* curr) {
        // if a block has an if br else br, we can un-conditionalize the latter,
        // allowing the if to become a br_if.
        // * note that if not in a block already, then we need to create a block
        //   for this, so not useful otherwise
        // * note that this only happens at the end of a block, as code after
        //   the if is dead
        // * note that we do this at the end, because un-conditionalizing can
        //   interfere with optimizeLoop()ing.
        auto& list = curr->list;
        for (Index i = 0; i < list.size(); i++) {
          auto* iff = list[i]->dynCast<If>();
          if (!iff || !iff->ifFalse) {
            // if it lacked an if-false, it would already be a br_if, as that's
            // the easy case
            continue;
          }
          auto* ifTrueBreak = iff->ifTrue->dynCast<Break>();
          if (ifTrueBreak && !ifTrueBreak->condition &&
              canTurnIfIntoBrIf(iff->condition,
                                ifTrueBreak->value,
                                passOptions,
                                *getModule())) {
            // we are an if-else where the ifTrue is a break without a
            // condition, so we can do this
            ifTrueBreak->condition = iff->condition;
            ifTrueBreak->finalize();
            list[i] = Builder(*getModule()).dropIfConcretelyTyped(ifTrueBreak);
            ExpressionManipulator::spliceIntoBlock(curr, i + 1, iff->ifFalse);
            continue;
          }
          // otherwise, perhaps we can flip the if
          auto* ifFalseBreak = iff->ifFalse->dynCast<Break>();
          if (ifFalseBreak && !ifFalseBreak->condition &&
              canTurnIfIntoBrIf(iff->condition,
                                ifFalseBreak->value,
                                passOptions,
                                *getModule())) {
            ifFalseBreak->condition =
              Builder(*getModule()).makeUnary(EqZInt32, iff->condition);
            ifFalseBreak->finalize();
            list[i] = Builder(*getModule()).dropIfConcretelyTyped(ifFalseBreak);
            ExpressionManipulator::spliceIntoBlock(curr, i + 1, iff->ifTrue);
            continue;
          }
        }
        if (list.size() >= 2) {
          // combine/optimize adjacent br_ifs + a br (maybe _if) right after it
          for (Index i = 0; i < list.size() - 1; i++) {
            auto* br1 = list[i]->dynCast<Break>();
            // avoid unreachable brs, as they are dead code anyhow, and after
            // merging them the outer scope could need type changes
            if (!br1 || !br1->condition || br1->type == Type::unreachable) {
              continue;
            }
            assert(!br1->value);
            auto* br2 = list[i + 1]->dynCast<Break>();
            if (!br2 || br1->name != br2->name) {
              continue;
            }
            assert(!br2->value); // same target as previous, which has no value
            // a br_if and then a br[_if] with the same target right after it
            if (br2->condition) {
              if (shrink && br2->type != Type::unreachable) {
                // Join adjacent br_ifs to the same target, making one br_if
                // with a "selectified" condition that executes both.
                if (!EffectAnalyzer(passOptions, *getModule(), br2->condition)
                       .hasSideEffects()) {
                  // it's ok to execute them both, do it
                  Builder builder(*getModule());
                  br1->condition =
                    builder.makeBinary(OrInt32, br1->condition, br2->condition);
                  ExpressionManipulator::nop(br2);
                }
              }
            } else {
              // merge, we go there anyhow
              Builder builder(*getModule());
              list[i] = builder.makeDrop(br1->condition);
            }
          }
          // Combine adjacent br_ifs that test the same value into a br_table,
          // when that makes sense.
          tablify(curr);
          // Pattern-patch ifs, recreating them when it makes sense.
          restructureIf(curr);
        }
      }